

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected-main.t.hpp
# Opt level: O3

ostream * lest::operator<<(ostream *os,expected<Explicit,_char> *v)

{
  bool bVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ostream *poVar4;
  size_type *psVar5;
  size_type sVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_70;
  ForStreamable<Explicit,_std::string> local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[expected:",10);
  bVar1 = (v->contained).super_storage_t_impl<Explicit,_char>.m_has_value;
  if (bVar1 != true) {
    local_80 = &aStack_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"[empty]","");
    sVar6 = local_78;
    paVar3 = &local_60.field_2;
    if (local_80 == &aStack_70) {
      local_60.field_2._8_8_ = aStack_70._8_8_;
      local_80 = paVar3;
    }
    local_78 = 0;
    aStack_70._M_allocated_capacity = aStack_70._M_allocated_capacity & 0xffffffffffffff00;
    if (local_80 == paVar3) {
      local_30._8_8_ = local_60.field_2._8_8_;
      local_80 = &local_30;
    }
    psVar5 = &local_60._M_string_length;
    local_60._M_dataplus._M_p = (pointer)paVar3;
    local_40 = local_80;
    goto LAB_002066bc;
  }
  make_string<Explicit>(&local_60,(Explicit *)v);
  paVar3 = &aStack_70;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == &local_60.field_2) {
    aStack_70._8_8_ = local_60.field_2._8_8_;
LAB_0020664f:
    local_40 = &local_30;
    local_30._8_8_ = aStack_70._8_8_;
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == paVar3) goto LAB_0020664f;
    local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_60._M_dataplus._M_p;
  }
  aStack_70._M_allocated_capacity = local_60.field_2._M_allocated_capacity;
  local_78 = local_60._M_string_length;
  psVar5 = &local_78;
  sVar6 = local_60._M_string_length;
LAB_002066bc:
  paVar2 = local_40;
  local_80 = &aStack_70;
  *psVar5 = 0;
  paVar3->_M_local_buf[0] = '\0';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,paVar2->_M_local_buf,sVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
  if (local_40 != &local_30) {
    operator_delete(local_40);
  }
  if ((bVar1 == false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2)) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_80 != &aStack_70) {
    operator_delete(local_80);
  }
  return poVar4;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, nonstd::expected<T,E> const & v )
{
    using lest::to_string;
    return os << "[expected:" << (v ? to_string(*v) : "[empty]") << "]";
}